

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-test.cpp
# Opt level: O3

void updtMem2(FOCC_CTA *foccOta,int mTid)

{
  long *plVar1;
  FILE *__stream;
  FOCC_CTA *this;
  uint uVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  tm *ptVar7;
  pthread_t pVar8;
  long lVar9;
  double dVar10;
  int locVal;
  time_t exitTime;
  time_t enterTime;
  char buf [40];
  uint local_98;
  uint local_94;
  FOCC_CTA *local_90;
  long local_88;
  int local_80;
  uint local_7c;
  uint local_78;
  int local_74;
  long local_70;
  long local_68;
  long local_60;
  char local_58 [40];
  
  if (0 < glb::numTrans) {
    local_70 = (long)mTid;
    local_80 = 0;
    local_90 = foccOta;
    do {
      local_68 = std::chrono::_V2::system_clock::now();
      uVar4 = 0;
      do {
        local_7c = uVar4;
        uVar4 = FOCC_CTA::begin_trans(local_90);
        iVar5 = rand();
        if (-1 < iVar5 % glb::M) {
          iVar5 = iVar5 % glb::M + 1;
          local_94 = uVar4;
          do {
            local_74 = iVar5;
            iVar5 = rand();
            lVar9 = (long)glb::M;
            local_78 = (uint)((long)iVar5 % lVar9);
            iVar6 = rand();
            this = local_90;
            iVar6 = iVar6 % glb::constVal;
            FOCC_CTA::read(local_90,local_94,(void *)((long)iVar5 % lVar9 & 0xffffffff),
                           (size_t)&local_98);
            local_88 = std::chrono::_V2::system_clock::now();
            local_88 = local_88 / 1000000000;
            ptVar7 = localtime(&local_88);
            strftime(local_58,0x28,"%H:%M:%S",ptVar7);
            __stream = glb::log_file;
            pVar8 = pthread_self();
            uVar2 = local_78;
            fprintf(__stream,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n",
                    pVar8,(ulong)local_94,(ulong)local_78,(ulong)local_98,local_58);
            local_98 = iVar6 + local_98;
            FOCC_CTA::write(this,local_94,(void *)(ulong)uVar2,(ulong)local_98);
            local_60 = std::chrono::_V2::system_clock::now();
            local_60 = local_60 / 1000000000;
            ptVar7 = localtime(&local_60);
            strftime(local_58,0x28,"%H:%M:%S",ptVar7);
            uVar4 = local_94;
            fprintf(glb::log_file,
                    "Thread ID %ld Transaction %d writes to %d a value %d at time %s\n",pVar8,
                    (ulong)local_94,(ulong)uVar2,(ulong)local_98,local_58);
            dVar10 = std::
                     generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                               ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                 *)&glb::generator);
            dVar10 = log(1.0 - dVar10);
            usleep((__useconds_t)(long)((dVar10 / glb::dist) * -1000.0));
            iVar5 = local_74 + -1;
          } while (iVar5 != 0);
        }
        cVar3 = FOCC_CTA::tryC(local_90,uVar4);
        local_88 = std::chrono::_V2::system_clock::now();
        local_88 = local_88 / 1000000000;
        ptVar7 = localtime(&local_88);
        strftime(local_58,0x28,"%H:%M:%S",ptVar7);
        fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n",(ulong)uVar4
                ,(ulong)(uint)(int)cVar3,local_58);
        uVar2 = local_7c;
        uVar4 = (cVar3 == 'a') + local_7c;
      } while (cVar3 != 'c');
      lVar9 = std::chrono::_V2::system_clock::now();
      plVar1 = (long *)(glb::total_delay + local_70 * 8);
      *plVar1 = *plVar1 + (lVar9 - local_68) / 1000000;
      plVar1 = (long *)(glb::total_aborts + local_70 * 8);
      *plVar1 = *plVar1 + (ulong)uVar2;
      local_80 = local_80 + 1;
    } while (local_80 < glb::numTrans);
  }
  return;
}

Assistant:

void updtMem2(FOCC_CTA* foccOta, int mTid){
    int abortCnt = 0;
    char status = glb::TRANS_ABORT;

    char buf[40];
    // each thread invokes numTrans Transactions!
    for(int curTrans=0; curTrans<glb::numTrans; curTrans++){
        abortCnt = 0;
        auto start = high_resolution_clock::now();
        do {
            int id = foccOta->begin_trans();
            int nItr = rand()%glb::M + 1;

            int locVal;

            for(int i=0; i<nItr; i++){
                // rnadom index to be updated.
                int randInd = rand()%glb::M;
                int randVal = rand()%glb::constVal;

                foccOta->read(id, randInd, &locVal);

                auto _reqTime = std::chrono::system_clock::now();
                time_t reqTime = std::chrono::system_clock::to_time_t(_reqTime);
                struct tm* tinfo= localtime(&reqTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
                fprintf(glb::log_file,"Thread ID %ld Transaction %d reads from %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                locVal+=randVal;

                foccOta->write(id, randInd, locVal);

                auto _enterTime = std::chrono::system_clock::now(); //the timepoint
                auto enterTime = std::chrono::system_clock::to_time_t(_enterTime);
                tinfo= localtime(&enterTime);
                strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);

                fprintf(glb::log_file,"Thread ID %ld Transaction %d writes to %d a value %d at time %s\n", std::this_thread::get_id()
                        , id, randInd, locVal, buf);

                usleep(1000*glb::dist(glb::generator));
            }

            status = foccOta->tryC(id);

            auto _exitTime = std::chrono::system_clock::now(); //the timepoint
            auto exitTime = std::chrono::system_clock::to_time_t(_exitTime);
            struct tm* tinfo= localtime(&exitTime);
            strftime (buf, sizeof (buf), "%H:%M:%S", tinfo);
            fprintf(glb::log_file,"Transaction %d tryCommits with result %c at time %s\n\n", id, status, buf);
            //fprintf(stdout,"Transaction %d tryCommits with result %c\n", id, status);

            if(status == glb::TRANS_ABORT) {abortCnt++;}

        } while(status!=glb::TRANS_COMMIT);

        auto time_to_commit = duration_cast<milliseconds>(high_resolution_clock::now() - start);
        glb::total_delay[mTid]+=time_to_commit.count();
        glb::total_aborts[mTid]+=abortCnt;
    } // for
}